

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O2

uint If_ManSatCheckXYall_int(void *pSat,int nLutSize,word *pTruth,int nVars,Vec_Int_t *vLits)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  uint local_b8 [4];
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  void *local_78;
  word *local_70;
  Vec_Int_t *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_68 = vLits;
  local_70 = pTruth;
  local_78 = pSat;
  if (4 < nLutSize - 2U) {
    __assert_fail("nLutSize >= 2 && nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10d,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  if ((nLutSize < nVars) && (nVars < nLutSize * 2)) {
    uVar9 = ~nVars + nLutSize * 2;
    if ((-1 < (int)uVar9) && (uVar9 < nLutSize - 1U)) {
      switch(nLutSize - 2U) {
      case 0:
        if (uVar9 != 0) {
          __assert_fail("nShared == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                        ,0x112,
                        "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)"
                       );
        }
        uVar9 = 2;
        for (iVar4 = 0; iVar4 != nVars; iVar4 = iVar4 + 1) {
          iVar11 = iVar4;
          uVar8 = uVar9;
          while (iVar11 = iVar11 + 1, iVar11 < nVars) {
            uVar10 = 1 << ((char)iVar4 * '\x02' & 0x1fU) | 1 << (uVar8 & 0x1f);
            iVar5 = If_ManSatCheckXY(local_78,2,local_70,nVars,uVar10,(word *)0x0,(word *)0x0,
                                     local_68);
            uVar8 = uVar8 + 2;
            if (iVar5 != 0) {
              return uVar10;
            }
          }
          uVar9 = uVar9 + 2;
        }
        break;
      case 1:
        uVar8 = 4;
        local_d0._0_4_ = 1;
        local_a0 = CONCAT44(local_a0._4_4_,uVar9);
        for (iVar4 = 0; iVar4 != nVars; iVar4 = iVar4 + 1) {
          iVar11 = (int)local_d0;
          uVar9 = uVar8;
          iVar5 = iVar4;
          while (iVar5 = iVar5 + 1, iVar5 < nVars) {
            iVar3 = iVar11;
            uVar10 = uVar9;
            while (iVar3 = iVar3 + 1, iVar3 < nVars) {
              uVar7 = 1 << ((char)iVar4 * '\x02' & 0x1fU) | 1 << (uVar10 & 0x1f) |
                      1 << ((char)iVar5 * '\x02' & 0x1fU);
              iVar2 = If_ManSatCheckXY(local_78,3,local_70,nVars,uVar7,(word *)0x0,(word *)0x0,
                                       local_68);
              uVar10 = uVar10 + 2;
              if (iVar2 != 0) {
                return uVar7;
              }
            }
            uVar9 = uVar9 + 2;
            iVar11 = iVar11 + 1;
            local_b8[2] = nVars;
          }
          uVar8 = uVar8 + 2;
          local_d0._0_4_ = (int)local_d0 + 1;
          local_b8[1] = nVars;
          uVar9 = (uint)local_a0;
        }
        if (uVar9 != 0) {
          for (uVar9 = 0; local_b8[0] = uVar9, uVar9 != nVars; uVar9 = uVar9 + 1) {
            uVar8 = uVar9;
            while( true ) {
              uVar10 = uVar8 + 1;
              local_b8[1] = uVar10;
              if (nVars <= (int)uVar10) break;
              for (iVar4 = uVar8 + 2; local_b8[2] = iVar4, uVar8 = uVar10, iVar4 < nVars;
                  iVar4 = iVar4 + 1) {
                lVar19 = 0;
                while (lVar19 != 3) {
                  uVar8 = 3 << ((char)local_b8[lVar19] * '\x02' & 0x1fU) |
                          1 << ((char)uVar9 * '\x02' & 0x1fU) | 1 << (iVar4 * 2 & 0x1fU) |
                          1 << ((char)uVar10 * '\x02' & 0x1fU);
                  iVar11 = If_ManSatCheckXY(local_78,3,local_70,nVars,uVar8,(word *)0x0,(word *)0x0,
                                            local_68);
                  lVar19 = lVar19 + 1;
                  if (iVar11 != 0) {
                    return uVar8;
                  }
                }
              }
            }
          }
        }
        break;
      case 2:
        uVar8 = 6;
        local_a0 = CONCAT44(local_a0._4_4_,uVar9);
        for (iVar4 = 0; iVar4 != nVars; iVar4 = iVar4 + 1) {
          local_98 = CONCAT44(local_98._4_4_,uVar8);
          uVar9 = uVar8;
          iVar11 = iVar4;
          while (iVar5 = iVar11 + 1, iVar5 < nVars) {
            uVar9 = uVar8;
            for (iVar11 = iVar11 + 2; iVar11 < nVars; iVar11 = iVar11 + 1) {
              uVar10 = uVar9;
              iVar3 = iVar11;
              while (iVar3 = iVar3 + 1, iVar3 < nVars) {
                uVar7 = 1 << ((char)iVar4 * '\x02' & 0x1fU) | 1 << (uVar10 & 0x1f) |
                        1 << ((char)iVar5 * '\x02' & 0x1fU) | 1 << ((char)iVar11 * '\x02' & 0x1fU);
                iVar2 = If_ManSatCheckXY(local_78,4,local_70,nVars,uVar7,(word *)0x0,(word *)0x0,
                                         local_68);
                uVar10 = uVar10 + 2;
                if (iVar2 != 0) {
                  return uVar7;
                }
              }
              uVar9 = uVar9 + 2;
              local_b8[3] = nVars;
            }
            uVar8 = uVar8 + 2;
            local_b8[2] = nVars;
            uVar9 = (uint)local_98;
            iVar11 = iVar5;
          }
          uVar8 = uVar9 + 2;
          local_b8[1] = nVars;
          uVar9 = (uint)local_a0;
        }
        if (uVar9 != 0) {
          for (uVar8 = 0; local_b8[0] = uVar8, uVar8 != nVars; uVar8 = uVar8 + 1) {
            uVar10 = uVar8;
            while( true ) {
              uVar7 = uVar10 + 1;
              local_b8[1] = uVar7;
              if (nVars <= (int)uVar7) break;
              for (iVar4 = uVar10 + 2; local_b8[2] = iVar4, iVar4 < nVars; iVar4 = iVar4 + 1) {
                iVar11 = iVar4;
                while( true ) {
                  iVar11 = iVar11 + 1;
                  local_b8[3] = iVar11;
                  if (nVars <= iVar11) break;
                  lVar19 = 0;
                  while (lVar19 != 4) {
                    uVar9 = 3 << ((char)local_b8[lVar19] * '\x02' & 0x1fU) |
                            1 << ((char)uVar8 * '\x02' & 0x1fU) | 1 << (iVar11 * 2 & 0x1fU) |
                            1 << ((char)uVar7 * '\x02' & 0x1fU) |
                            1 << ((char)iVar4 * '\x02' & 0x1fU);
                    iVar5 = If_ManSatCheckXY(local_78,4,local_70,nVars,uVar9,(word *)0x0,(word *)0x0
                                             ,local_68);
                    lVar19 = lVar19 + 1;
                    if (iVar5 != 0) {
                      return uVar9;
                    }
                  }
                }
              }
              uVar9 = (uint)local_a0;
              uVar10 = uVar7;
            }
          }
          if (1 < (int)uVar9) {
            local_98 = 0;
            while (local_b8[0] = (uint)local_98, (uint)local_98 != nVars) {
              cVar1 = (char)local_98;
              local_90 = local_98;
              while( true ) {
                iVar4 = (int)local_98;
                uVar9 = iVar4 + 1;
                local_b8[1] = uVar9;
                if (nVars <= (int)uVar9) break;
                local_98 = (ulong)uVar9;
                for (iVar4 = iVar4 + 2; local_b8[2] = iVar4, iVar4 < nVars; iVar4 = iVar4 + 1) {
                  local_a0 = CONCAT44(local_a0._4_4_,1 << ((char)iVar4 * '\x02' & 0x1fU));
                  iVar11 = iVar4;
                  while( true ) {
                    iVar11 = iVar11 + 1;
                    local_b8[3] = iVar11;
                    if (nVars <= iVar11) break;
                    uVar8 = 1 << (cVar1 * '\x02' & 0x1fU) | 1 << (iVar11 * 2 & 0x1fU) |
                            1 << ((char)uVar9 * '\x02' & 0x1fU) | (uint)local_a0;
                    lVar19 = 1;
                    lVar13 = 0;
                    while (lVar13 != 4) {
                      lVar15 = lVar19;
                      while (lVar15 != 4) {
                        uVar10 = 3 << ((char)local_b8[lVar15] * '\x02' & 0x1fU) |
                                 3 << ((char)local_b8[lVar13] * '\x02' & 0x1fU) | uVar8;
                        iVar5 = If_ManSatCheckXY(local_78,4,local_70,nVars,uVar10,(word *)0x0,
                                                 (word *)0x0,local_68);
                        lVar15 = lVar15 + 1;
                        if (iVar5 != 0) {
                          return uVar10;
                        }
                      }
                      lVar19 = lVar19 + 1;
                      lVar13 = lVar13 + 1;
                    }
                  }
                }
              }
              local_98 = (ulong)((int)local_90 + 1);
            }
          }
        }
        break;
      case 3:
        iVar4 = 3;
        iVar11 = 8;
        local_a0 = CONCAT44(local_a0._4_4_,uVar9);
        uVar8 = 0;
        while (uVar18 = (ulong)uVar8, uVar8 != nVars) {
          local_58 = CONCAT44(local_58._4_4_,iVar4);
          local_60 = uVar18;
          local_48 = CONCAT44(local_48._4_4_,iVar11);
          iVar5 = iVar4;
          iVar3 = iVar11;
          while( true ) {
            uVar10 = (int)uVar18 + 1;
            if (nVars <= (int)uVar10) break;
            local_50 = (ulong)uVar10;
            local_98 = CONCAT44(local_98._4_4_,iVar11);
            local_88 = CONCAT44(local_88._4_4_,iVar4);
            local_80 = CONCAT44(local_80._4_4_,iVar11);
            uVar9 = (int)uVar18 + 2;
            iVar5 = iVar4;
            while (uVar18 = (ulong)uVar9, (int)uVar9 < nVars) {
              iVar11 = iVar4;
              uVar7 = (uint)local_98;
              local_90 = uVar18;
              while( true ) {
                uVar16 = (int)uVar18 + 1;
                uVar18 = (ulong)uVar16;
                if (nVars <= (int)uVar16) break;
                iVar5 = iVar11;
                uVar6 = uVar7;
                while (iVar5 = iVar5 + 1, iVar5 < nVars) {
                  uVar17 = 1 << ((char)uVar8 * '\x02' & 0x1fU) | 1 << (uVar6 & 0x1f) |
                           1 << ((char)uVar10 * '\x02' & 0x1fU) |
                           1 << ((char)uVar9 * '\x02' & 0x1fU) |
                           1 << ((char)uVar16 * '\x02' & 0x1fU);
                  iVar3 = If_ManSatCheckXY(local_78,5,local_70,nVars,uVar17,(word *)0x0,(word *)0x0,
                                           local_68);
                  uVar6 = uVar6 + 2;
                  if (iVar3 != 0) {
                    return uVar17;
                  }
                }
                uVar7 = uVar7 + 2;
                iVar11 = iVar11 + 1;
                local_a8 = nVars;
              }
              local_98 = CONCAT44(local_98._4_4_,(uint)local_98 + 2);
              iVar4 = iVar4 + 1;
              local_b8[3] = nVars;
              iVar5 = (uint)local_88;
              iVar11 = (uint)local_80;
              uVar9 = (int)local_90 + 1;
            }
            iVar11 = iVar11 + 2;
            iVar4 = iVar5 + 1;
            uVar18 = local_50 & 0xffffffff;
            local_b8[2] = nVars;
            uVar9 = (uint)local_a0;
            iVar5 = (uint)local_58;
            iVar3 = (uint)local_48;
          }
          iVar11 = iVar3 + 2;
          iVar4 = iVar5 + 1;
          local_b8[1] = nVars;
          uVar8 = (int)local_60 + 1;
        }
        if (uVar9 != 0) {
          for (uVar18 = 0; local_b8[0] = (uint)uVar18, (uint)uVar18 != nVars;
              uVar18 = (ulong)((int)uVar18 + 1)) {
            cVar1 = (char)uVar18;
            local_98 = uVar18;
            local_90 = uVar18;
            while( true ) {
              iVar4 = (int)local_90;
              uVar8 = iVar4 + 1;
              local_b8[1] = uVar8;
              if (nVars <= (int)uVar8) break;
              local_90 = (ulong)uVar8;
              for (iVar4 = iVar4 + 2; local_b8[2] = iVar4, iVar4 < nVars; iVar4 = iVar4 + 1) {
                iVar11 = iVar4;
                while( true ) {
                  iVar5 = iVar11 + 1;
                  local_b8[3] = iVar5;
                  if (nVars <= iVar5) break;
                  for (iVar3 = iVar11 + 2; local_a8 = iVar3, iVar11 = iVar5, iVar3 < nVars;
                      iVar3 = iVar3 + 1) {
                    lVar19 = 0;
                    while (lVar19 != 5) {
                      uVar9 = 3 << ((char)local_b8[lVar19] * '\x02' & 0x1fU) |
                              1 << (cVar1 * '\x02' & 0x1fU) | 1 << (iVar3 * 2 & 0x1fU) |
                              1 << ((char)uVar8 * '\x02' & 0x1fU) |
                              1 << ((char)iVar4 * '\x02' & 0x1fU) |
                              1 << ((char)iVar5 * '\x02' & 0x1fU);
                      iVar11 = If_ManSatCheckXY(local_78,5,local_70,nVars,uVar9,(word *)0x0,
                                                (word *)0x0,local_68);
                      lVar19 = lVar19 + 1;
                      if (iVar11 != 0) {
                        return uVar9;
                      }
                    }
                  }
                }
                uVar18 = local_98;
                uVar9 = (uint)local_a0;
              }
            }
          }
          if (1 < (int)uVar9) {
            local_88 = 0;
            while (local_b8[0] = (uint)local_88, (uint)local_88 != nVars) {
              cVar1 = (char)local_88;
              local_80 = local_88;
              while( true ) {
                uVar9 = (int)local_88 + 1;
                local_b8[1] = uVar9;
                if (nVars <= (int)uVar9) break;
                uVar8 = (int)local_88 + 2;
                local_88 = (ulong)uVar9;
                while( true ) {
                  local_98 = (ulong)uVar8;
                  local_b8[2] = uVar8;
                  if (nVars <= (int)uVar8) break;
                  local_90 = local_98;
                  while( true ) {
                    iVar4 = (int)local_98;
                    uVar10 = iVar4 + 1;
                    local_b8[3] = uVar10;
                    if (nVars <= (int)uVar10) break;
                    local_98 = (ulong)uVar10;
                    for (iVar4 = iVar4 + 2; local_a8 = iVar4, iVar4 < nVars; iVar4 = iVar4 + 1) {
                      lVar19 = 0;
                      while (lVar13 = lVar19, lVar13 != 5) {
                        lVar15 = lVar13;
                        while (lVar19 = lVar13 + 1, lVar15 != 4) {
                          uVar7 = 3 << ((char)local_b8[lVar15 + 1] * '\x02' & 0x1fU) |
                                  3 << ((char)local_b8[lVar13] * '\x02' & 0x1fU) |
                                  1 << (cVar1 * '\x02' & 0x1fU) | 1 << (iVar4 * 2 & 0x1fU) |
                                  1 << ((char)uVar9 * '\x02' & 0x1fU) |
                                  1 << ((char)uVar8 * '\x02' & 0x1fU) |
                                  1 << ((char)uVar10 * '\x02' & 0x1fU);
                          iVar11 = If_ManSatCheckXY(local_78,5,local_70,nVars,uVar7,(word *)0x0,
                                                    (word *)0x0,local_68);
                          lVar15 = lVar15 + 1;
                          if (iVar11 != 0) {
                            return uVar7;
                          }
                        }
                      }
                    }
                  }
                  uVar8 = (int)local_90 + 1;
                }
              }
              local_88 = (ulong)((int)local_80 + 1);
            }
            if ((uint)local_a0 != 2) {
              local_d0 = 0;
              while( true ) {
                uVar9 = (uint)local_d0;
                local_b8[0] = uVar9;
                if (uVar9 == nVars) break;
                local_60 = CONCAT44(local_60._4_4_,1 << ((char)local_d0 * '\x02' & 0x1fU));
                local_e0 = local_d0;
                while( true ) {
                  local_b8[1] = (int)local_e0 + 1;
                  local_88 = (ulong)local_b8[1];
                  if (nVars <= (int)local_b8[1]) break;
                  uVar8 = (int)local_e0 + 2;
                  local_58 = CONCAT44(local_58._4_4_,1 << ((char)local_b8[1] * '\x02' & 0x1fU));
                  while( true ) {
                    local_e0 = (ulong)uVar8;
                    local_b8[2] = uVar8;
                    if (nVars <= (int)uVar8) break;
                    local_50 = CONCAT44(local_50._4_4_,1 << ((char)uVar8 * '\x02' & 0x1fU));
                    local_d8 = local_e0;
                    while( true ) {
                      local_b8[3] = (int)local_d8 + 1;
                      local_90 = (ulong)local_b8[3];
                      if (nVars <= (int)local_b8[3]) break;
                      local_80 = CONCAT44(local_80._4_4_,1 << ((char)local_b8[3] * '\x02' & 0x1fU));
                      for (iVar4 = (int)local_d8 + 2; local_a8 = iVar4, iVar4 < nVars;
                          iVar4 = iVar4 + 1) {
                        uVar10 = (uint)local_60 | 1 << (iVar4 * 2 & 0x1fU) | (uint)local_58 |
                                 (uint)local_50 | (uint)local_80;
                        local_c0 = 1;
                        local_98 = 2;
                        lVar19 = 0;
                        while (lVar19 != 5) {
                          local_48 = lVar19 + 1;
                          local_a0 = local_98;
                          lVar13 = local_c0;
                          while (lVar13 != 5) {
                            uVar18 = local_a0;
                            while (uVar18 < 5) {
                              uVar7 = 3 << ((char)local_b8[uVar18] * '\x02' & 0x1fU) | uVar10 |
                                      3 << ((char)local_b8[lVar13] * '\x02' & 0x1fU) |
                                      3 << ((char)local_b8[lVar19] * '\x02' & 0x1fU);
                              iVar11 = If_ManSatCheckXY(local_78,5,local_70,nVars,uVar7,(word *)0x0,
                                                        (word *)0x0,local_68);
                              uVar18 = uVar18 + 1;
                              if (iVar11 != 0) {
                                return uVar7;
                              }
                            }
                            local_a0 = local_a0 + 1;
                            lVar13 = lVar13 + 1;
                          }
                          local_98 = local_98 + 1;
                          local_c0 = local_c0 + 1;
                          lVar19 = local_48;
                        }
                      }
                      local_d8 = local_90;
                    }
                    uVar8 = uVar8 + 1;
                  }
                  local_e0 = local_88;
                }
                local_d0 = (ulong)(uVar9 + 1);
              }
            }
          }
        }
        break;
      default:
        uVar8 = 10;
        local_a0 = CONCAT44(local_a0._4_4_,uVar9);
        for (uVar18 = 0; (int)uVar18 != nVars; uVar18 = (ulong)((int)uVar18 + 1)) {
          cVar1 = (char)uVar18;
          local_50 = uVar18;
          local_58 = CONCAT44(local_58._4_4_,uVar8);
          uVar14 = uVar18;
          uVar10 = uVar8;
          while( true ) {
            uVar7 = (int)uVar14 + 1;
            if (nVars <= (int)uVar7) break;
            local_60 = (ulong)uVar7;
            local_80 = CONCAT44(local_80._4_4_,uVar10);
            uVar16 = (int)uVar14 + 2;
            uVar9 = uVar10;
            while ((int)uVar16 < nVars) {
              local_88 = CONCAT44(local_88._4_4_,uVar10);
              uVar18 = (ulong)uVar16;
              local_90 = (ulong)uVar16;
              uVar9 = uVar10;
              while( true ) {
                uVar8 = (int)uVar18 + 1;
                if (nVars <= (int)uVar8) break;
                uVar9 = uVar10;
                local_98 = (ulong)uVar8;
                for (iVar4 = (int)uVar18 + 2; iVar4 < nVars; iVar4 = iVar4 + 1) {
                  uVar6 = uVar9;
                  iVar11 = iVar4;
                  while (iVar11 = iVar11 + 1, iVar11 < nVars) {
                    uVar17 = 1 << (cVar1 * '\x02' & 0x1fU) | 1 << (uVar6 & 0x1f) |
                             1 << ((char)uVar7 * '\x02' & 0x1fU) |
                             1 << ((char)uVar16 * '\x02' & 0x1fU) |
                             1 << ((char)uVar8 * '\x02' & 0x1fU) |
                             1 << ((char)iVar4 * '\x02' & 0x1fU);
                    iVar5 = If_ManSatCheckXY(local_78,6,local_70,nVars,uVar17,(word *)0x0,
                                             (word *)0x0,local_68);
                    uVar6 = uVar6 + 2;
                    if (iVar5 != 0) {
                      return uVar17;
                    }
                  }
                  uVar9 = uVar9 + 2;
                  local_a4 = nVars;
                }
                uVar10 = uVar10 + 2;
                uVar18 = local_98;
                local_a8 = nVars;
                uVar9 = (uint)local_88;
              }
              uVar10 = uVar9 + 2;
              uVar18 = local_50;
              local_b8[3] = nVars;
              uVar9 = (uint)local_80;
              uVar8 = (uint)local_58;
              uVar16 = (int)local_90 + 1;
            }
            uVar10 = uVar9 + 2;
            uVar14 = local_60;
            local_b8[2] = nVars;
            uVar9 = (uint)local_a0;
          }
          uVar8 = uVar8 + 2;
          local_b8[1] = nVars;
        }
        if (uVar9 != 0) {
          for (uVar18 = 0; local_b8[0] = (uint)uVar18, (uint)uVar18 != nVars;
              uVar18 = (ulong)((int)uVar18 + 1)) {
            cVar1 = (char)uVar18;
            local_90 = uVar18;
            uVar14 = uVar18;
            while( true ) {
              uVar8 = (int)uVar14 + 1;
              local_b8[1] = uVar8;
              if (nVars <= (int)uVar8) break;
              uVar10 = (int)uVar14 + 2;
              local_80 = (ulong)uVar8;
              while( true ) {
                local_88 = (ulong)uVar10;
                local_b8[2] = uVar10;
                uVar14 = local_80;
                if (nVars <= (int)uVar10) break;
                uVar7 = 1 << ((char)uVar10 * '\x02' & 0x1fU);
                local_98 = CONCAT44(local_98._4_4_,uVar7);
                while( true ) {
                  iVar4 = (int)local_88;
                  local_b8[3] = iVar4 + 1;
                  if (nVars <= (int)local_b8[3]) break;
                  local_88 = (ulong)local_b8[3];
                  uVar16 = 1 << ((char)local_b8[3] * '\x02' & 0x1fU) | uVar7;
                  for (iVar4 = iVar4 + 2; local_a8 = iVar4, iVar4 < nVars; iVar4 = iVar4 + 1) {
                    iVar11 = iVar4;
                    while( true ) {
                      iVar11 = iVar11 + 1;
                      local_a4 = iVar11;
                      if (nVars <= iVar11) break;
                      lVar19 = 0;
                      while (lVar19 != 6) {
                        uVar9 = 3 << ((char)local_b8[lVar19] * '\x02' & 0x1fU) |
                                1 << (cVar1 * '\x02' & 0x1fU) | 1 << (iVar11 * 2 & 0x1fU) |
                                1 << ((char)uVar8 * '\x02' & 0x1fU) |
                                1 << ((char)iVar4 * '\x02' & 0x1fU) | uVar16;
                        iVar5 = If_ManSatCheckXY(local_78,6,local_70,nVars,uVar9,(word *)0x0,
                                                 (word *)0x0,local_68);
                        lVar19 = lVar19 + 1;
                        if (iVar5 != 0) {
                          return uVar9;
                        }
                      }
                    }
                    uVar18 = local_90;
                    uVar7 = (uint)local_98;
                    uVar9 = (uint)local_a0;
                  }
                }
                uVar10 = uVar10 + 1;
              }
            }
          }
          if (1 < (int)uVar9) {
            uVar18 = 0;
            while (local_b8[0] = (uint)uVar18, (uint)uVar18 != nVars) {
              local_60 = uVar18;
              uVar14 = uVar18;
              while( true ) {
                uVar9 = (int)uVar14 + 1;
                local_b8[1] = uVar9;
                if (nVars <= (int)uVar9) break;
                local_b8[2] = (int)uVar14 + 2;
                local_58 = (ulong)uVar9;
                while( true ) {
                  uVar14 = local_58;
                  if (nVars <= (int)local_b8[2]) break;
                  local_90 = CONCAT44(local_90._4_4_,1 << ((char)local_b8[2] * '\x02' & 0x1fU));
                  local_50 = (ulong)local_b8[2];
                  uVar14 = (ulong)local_b8[2];
                  while( true ) {
                    local_b8[3] = (int)uVar14 + 1;
                    if (nVars <= (int)local_b8[3]) break;
                    local_a8 = (int)uVar14 + 2;
                    local_80 = (ulong)local_b8[3];
                    local_98 = CONCAT44(local_98._4_4_,
                                        1 << ((char)local_b8[3] * '\x02' & 0x1fU) | (uint)local_90);
                    while( true ) {
                      uVar12 = (ulong)local_a8;
                      uVar14 = local_80;
                      if (nVars <= (int)local_a8) break;
                      uVar8 = 1 << ((char)local_a8 * '\x02' & 0x1fU) | (uint)local_98;
                      local_88 = uVar12;
                      while( true ) {
                        uVar10 = (int)uVar12 + 1;
                        uVar12 = (ulong)uVar10;
                        local_a4 = uVar10;
                        if (nVars <= (int)uVar10) break;
                        lVar19 = 1;
                        lVar13 = 0;
                        while (lVar13 != 6) {
                          lVar15 = lVar19;
                          while (lVar15 != 6) {
                            uVar7 = 3 << ((char)local_b8[lVar15] * '\x02' & 0x1fU) |
                                    3 << ((char)local_b8[lVar13] * '\x02' & 0x1fU) |
                                    1 << ((char)uVar18 * '\x02' & 0x1fU) | 1 << (uVar10 * 2 & 0x1f)
                                    | 1 << ((char)uVar9 * '\x02' & 0x1fU) | uVar8;
                            iVar4 = If_ManSatCheckXY(local_78,6,local_70,nVars,uVar7,(word *)0x0,
                                                     (word *)0x0,local_68);
                            lVar15 = lVar15 + 1;
                            if (iVar4 != 0) {
                              return uVar7;
                            }
                          }
                          lVar19 = lVar19 + 1;
                          lVar13 = lVar13 + 1;
                        }
                      }
                      local_a8 = (int)local_88 + 1;
                    }
                  }
                  local_b8[2] = (int)local_50 + 1;
                }
              }
              uVar18 = (ulong)((int)local_60 + 1);
            }
            if ((uint)local_a0 != 2) {
              local_c8 = 0;
              while( true ) {
                uVar9 = (uint)local_c8;
                local_b8[0] = uVar9;
                if (uVar9 == nVars) break;
                local_58 = CONCAT44(local_58._4_4_,1 << ((char)local_c8 * '\x02' & 0x1fU));
                while( true ) {
                  local_b8[1] = (int)local_c8 + 1;
                  local_80 = (ulong)local_b8[1];
                  if (nVars <= (int)local_b8[1]) break;
                  uVar8 = (int)local_c8 + 2;
                  local_60 = CONCAT44(local_60._4_4_,1 << ((char)local_b8[1] * '\x02' & 0x1fU));
                  while( true ) {
                    local_e0 = (ulong)uVar8;
                    local_b8[2] = uVar8;
                    local_c8 = local_80;
                    if (nVars <= (int)uVar8) break;
                    local_38 = CONCAT44(local_38._4_4_,1 << ((char)uVar8 * '\x02' & 0x1fU));
                    local_d8 = local_e0;
                    while( true ) {
                      local_b8[3] = (int)local_d8 + 1;
                      local_88 = (ulong)local_b8[3];
                      if (nVars <= (int)local_b8[3]) break;
                      local_48 = CONCAT44(local_48._4_4_,
                                          1 << ((char)local_b8[3] * '\x02' & 0x1fU) | (uint)local_38
                                         );
                      for (iVar4 = (int)local_d8 + 2; local_a8 = iVar4, iVar4 < nVars;
                          iVar4 = iVar4 + 1) {
                        local_50 = CONCAT44(local_50._4_4_,
                                            1 << ((char)iVar4 * '\x02' & 0x1fU) | (uint)local_48);
                        iVar11 = iVar4;
                        while( true ) {
                          iVar11 = iVar11 + 1;
                          local_a4 = iVar11;
                          if (nVars <= iVar11) break;
                          uVar10 = (uint)local_58 | 1 << (iVar11 * 2 & 0x1fU) | (uint)local_60 |
                                   (uint)local_50;
                          local_98 = 1;
                          local_90 = 2;
                          lVar19 = 0;
                          while (lVar19 != 6) {
                            local_40 = lVar19 + 1;
                            local_d0 = local_90;
                            uVar18 = local_98;
                            while (uVar18 != 6) {
                              uVar14 = local_d0;
                              while (uVar14 < 6) {
                                uVar7 = 3 << ((char)local_b8[uVar14] * '\x02' & 0x1fU) | uVar10 |
                                        3 << ((char)local_b8[uVar18] * '\x02' & 0x1fU) |
                                        3 << ((char)local_b8[lVar19] * '\x02' & 0x1fU);
                                iVar5 = If_ManSatCheckXY(local_78,6,local_70,nVars,uVar7,(word *)0x0
                                                         ,(word *)0x0,local_68);
                                uVar14 = uVar14 + 1;
                                if (iVar5 != 0) {
                                  return uVar7;
                                }
                              }
                              local_d0 = local_d0 + 1;
                              uVar18 = uVar18 + 1;
                            }
                            local_90 = local_90 + 1;
                            local_98 = local_98 + 1;
                            lVar19 = local_40;
                          }
                        }
                      }
                      local_d8 = local_88;
                    }
                    uVar8 = uVar8 + 1;
                  }
                }
                local_c8 = (ulong)(uVar9 + 1);
              }
              if (3 < (int)(uint)local_a0) {
                for (uVar9 = 0; local_b8[0] = uVar9, uVar9 != nVars; uVar9 = uVar9 + 1) {
                  local_50 = CONCAT44(local_50._4_4_,1 << ((char)uVar9 * '\x02' & 0x1fU));
                  uVar8 = uVar9;
                  while( true ) {
                    uVar10 = uVar8 + 1;
                    local_b8[1] = uVar10;
                    if (nVars <= (int)uVar10) break;
                    local_58 = CONCAT44(local_58._4_4_,1 << ((char)uVar10 * '\x02' & 0x1fU));
                    for (local_a0 = (ulong)(uVar8 + 2); local_b8[2] = (int)local_a0, uVar8 = uVar10,
                        (int)local_a0 < nVars; local_a0 = (ulong)((int)local_a0 + 1)) {
                      local_48 = CONCAT44(local_48._4_4_,1 << ((char)local_a0 * '\x02' & 0x1fU));
                      local_e0 = local_a0;
                      while( true ) {
                        local_b8[3] = (int)local_e0 + 1;
                        local_98 = (ulong)local_b8[3];
                        if (nVars <= (int)local_b8[3]) break;
                        local_60 = CONCAT44(local_60._4_4_,
                                            1 << ((char)local_b8[3] * '\x02' & 0x1fU) |
                                            (uint)local_48);
                        for (iVar4 = (int)local_e0 + 2; local_a8 = iVar4, iVar4 < nVars;
                            iVar4 = iVar4 + 1) {
                          local_80 = CONCAT44(local_80._4_4_,
                                              1 << ((char)iVar4 * '\x02' & 0x1fU) | (uint)local_60);
                          iVar11 = iVar4;
                          while( true ) {
                            iVar11 = iVar11 + 1;
                            local_a4 = iVar11;
                            if (nVars <= iVar11) break;
                            uVar8 = (uint)local_50 | 1 << (iVar11 * 2 & 0x1fU) | (uint)local_58 |
                                    (uint)local_80;
                            local_90 = 1;
                            local_88 = 2;
                            local_d8 = 0;
                            while (local_d8 != 6) {
                              local_40 = local_d8 + 1;
                              local_d0 = local_88;
                              uVar18 = local_90;
                              while (uVar18 != 6) {
                                local_38 = uVar18 + 1;
                                for (uVar14 = local_d0; uVar12 = local_d0, uVar14 < 6;
                                    uVar14 = uVar14 + 1) {
                                  while (uVar12 < 6) {
                                    uVar7 = 3 << ((char)local_b8[uVar12] * '\x02' & 0x1fU) |
                                            3 << ((char)local_b8[uVar14] * '\x02' & 0x1fU) |
                                            3 << ((char)local_b8[uVar18] * '\x02' & 0x1fU) |
                                            3 << ((char)local_b8[local_d8] * '\x02' & 0x1fU) | uVar8
                                    ;
                                    iVar5 = If_ManSatCheckXY(local_78,6,local_70,nVars,uVar7,
                                                             (word *)0x0,(word *)0x0,local_68);
                                    uVar12 = uVar12 + 1;
                                    if (iVar5 != 0) {
                                      return uVar7;
                                    }
                                  }
                                }
                                local_d0 = local_d0 + 1;
                                uVar18 = local_38;
                              }
                              local_88 = local_88 + 1;
                              local_90 = local_90 + 1;
                              local_d8 = local_40;
                            }
                          }
                        }
                        local_e0 = local_98;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      return 0;
    }
    __assert_fail("nShared >= 0 && nShared < nLutSize - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10f,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  __assert_fail("nLutSize < nVars && nVars <= nTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                ,0x10e,"unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)"
               );
}

Assistant:

unsigned If_ManSatCheckXYall_int( void * pSat, int nLutSize, word * pTruth, int nVars, Vec_Int_t * vLits )
{
    unsigned uSet = 0;
    int nTotal = 2 * nLutSize - 1;
    int nShared = nTotal - nVars;
    int i[6], s[4];
    assert( nLutSize >= 2 && nLutSize <= 6 );
    assert( nLutSize < nVars && nVars <= nTotal );
    assert( nShared >= 0 && nShared < nLutSize - 1 );
    if ( nLutSize == 2 )
    {
        assert( nShared == 0 );
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
    }
    else if ( nLutSize == 3 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
    }
    else if ( nLutSize == 4 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            {
                for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
                for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                    if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                        return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
            }
        }
    }
    else if ( nLutSize == 5 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
    }
    else if ( nLutSize == 6 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
        if ( nShared < 4 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
            for ( s[3] = s[1]+1; s[3] < nLutSize; s[3]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]]));
        }
    }
    return 0;
}